

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_ToIndex(JSContext *ctx,uint64_t *plen,JSValue val)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int64_t v;
  ulong local_20;
  
  if (0xfffffff4 < (uint)val.tag) {
    *(int *)val.u.ptr = *val.u.ptr + 1;
  }
  iVar1 = JS_ToInt64SatFree(ctx,(int64_t *)&local_20,val);
  iVar2 = -1;
  if (iVar1 == 0) {
    iVar2 = 0;
    uVar3 = local_20;
    if (local_20 >> 0x35 != 0) {
      uVar3 = 0;
      JS_ThrowRangeError(ctx,"invalid array index");
      iVar2 = -1;
    }
    *plen = uVar3;
  }
  return iVar2;
}

Assistant:

int JS_ToIndex(JSContext *ctx, uint64_t *plen, JSValueConst val)
{
    int64_t v;
    if (JS_ToInt64Sat(ctx, &v, val))
        return -1;
    if (v < 0 || v > MAX_SAFE_INTEGER) {
        JS_ThrowRangeError(ctx, "invalid array index");
        *plen = 0;
        return -1;
    }
    *plen = v;
    return 0;
}